

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# onesided.c
# Opt level: O0

void ngai_acc_common(Integer g_a,Integer *lo,Integer *hi,void *buf,Integer *ld,void *alpha,
                    Integer *nbhandle)

{
  int iVar1;
  void *src_ptr;
  long in_RCX;
  long in_RDX;
  long *in_RSI;
  long in_RDI;
  long in_R8;
  Integer *in_R9;
  long in_stack_00000008;
  int _d_3;
  int _i;
  int _d_2;
  Integer _factor;
  Integer _d_1;
  char *prem;
  char *pbuf;
  Integer *phi;
  Integer *plo;
  Integer idx_buf;
  int count [7];
  int stride_loc [7];
  int stride_rem [7];
  Integer ldrem [7];
  int _d;
  char err_string_1 [256];
  char err_string [256];
  _iterator_hdl it_hdl;
  Integer *rank_rstrctd;
  Integer n_rstrctd;
  int num_loops;
  int proc;
  int cond;
  int ndim;
  int loop;
  int optype;
  Integer ga_nbhandle;
  Integer p_handle;
  Integer type;
  Integer size;
  Integer elems;
  Integer idx;
  Integer handle;
  Integer np;
  Integer p;
  int in_stack_fffffffffffff920;
  armci_domain_t in_stack_fffffffffffff924;
  undefined4 in_stack_fffffffffffff92c;
  armci_hdl_t *in_stack_fffffffffffff930;
  undefined4 in_stack_fffffffffffff938;
  undefined4 in_stack_fffffffffffff93c;
  Integer *in_stack_fffffffffffff940;
  void *in_stack_fffffffffffff948;
  int *in_stack_fffffffffffff950;
  int optype_00;
  int *in_stack_fffffffffffff960;
  int in_stack_fffffffffffff968;
  int in_stack_fffffffffffff970;
  int in_stack_fffffffffffff974;
  int local_684;
  long lVar2;
  armci_hdl_t *nb_handle;
  undefined8 local_670;
  int iStack_66c;
  long local_660;
  long *local_658;
  long local_650;
  int local_648 [8];
  int local_628 [8];
  int local_608 [8];
  undefined8 local_5e8 [7];
  int local_5ac;
  char local_5a8 [96];
  Integer in_stack_fffffffffffffab8;
  char *in_stack_fffffffffffffac0;
  _iterator_hdl *in_stack_fffffffffffffb18;
  Integer *in_stack_fffffffffffffb20;
  Integer *in_stack_fffffffffffffb28;
  Integer in_stack_fffffffffffffb30;
  char local_4a8 [256];
  _iterator_hdl local_3a8;
  C_Integer *local_a8;
  C_Integer local_a0;
  int local_98;
  int local_94;
  uint local_90;
  int local_8c;
  int local_88;
  undefined4 local_84;
  long local_78;
  long local_70;
  long local_68;
  long local_60;
  long local_50;
  long local_48;
  Integer *local_38;
  long local_30;
  long local_28;
  long local_20;
  long *local_18;
  long local_10;
  
  local_48 = 0;
  local_50 = in_RDI + 1000;
  local_84 = 0xffffffff;
  local_98 = 2;
  local_38 = in_R9;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if ((in_RDI + 1000 < 0) || ((long)_max_global_array <= in_RDI + 1000)) {
    sprintf(local_4a8,"%s: INVALID ARRAY HANDLE","ngai_acc_common");
    pnga_error(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  }
  if (GA[local_10 + 1000].actv == 0) {
    sprintf(local_5a8,"%s: ARRAY NOT ACTIVE","ngai_acc_common");
    pnga_error(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  }
  local_68 = (long)GA[local_50].elemsize;
  local_70 = (long)GA[local_50].type;
  local_8c = (int)GA[local_50].ndim;
  local_78 = (long)GA[local_50].p_handle;
  local_a0 = GA[local_50].num_rstrctd;
  local_a8 = GA[local_50].rank_rstrctd;
  if (local_70 == 0x3ec) {
    local_84 = 0x26;
  }
  else if (local_70 == 0x3eb) {
    local_84 = 0x27;
  }
  else if (local_70 == 0x3ef) {
    local_84 = 0x29;
  }
  else if (local_70 == 0x3ee) {
    local_84 = 0x28;
  }
  else if (local_70 == 0x3e9) {
    local_84 = 0x25;
  }
  else if (local_70 == 0x3ea) {
    local_84 = 0x2a;
  }
  else {
    pnga_error(in_stack_fffffffffffffac0,in_stack_fffffffffffffab8);
  }
  gai_iterator_init(in_stack_fffffffffffffb30,in_stack_fffffffffffffb28,in_stack_fffffffffffffb20,
                    in_stack_fffffffffffffb18);
  local_60 = 1;
  for (local_5ac = 0; local_5ac < local_8c; local_5ac = local_5ac + 1) {
    local_60 = ((*(long *)(local_20 + (long)local_5ac * 8) - local_18[local_5ac]) + 1) * local_60;
  }
  GAbytes.acctot = (double)local_68 * (double)local_60 + GAbytes.acctot;
  GAstat.numacc = GAstat.numacc + 1;
  GAstat.numacc_procs = local_48 + GAstat.numacc_procs;
  if (in_stack_00000008 == 0) {
    ga_init_nbhandle(in_stack_fffffffffffff940);
  }
  else {
    ga_init_nbhandle(in_stack_fffffffffffff940);
  }
  for (local_88 = 0; local_88 < local_98; local_88 = local_88 + 1) {
    gai_iterator_reset(&local_3a8);
    while (iVar1 = gai_iterator_next((_iterator_hdl *)err_string._40_8_,(int *)err_string._32_8_,
                                     (Integer **)err_string._24_8_,(Integer **)err_string._16_8_,
                                     (char **)err_string._8_8_,(Integer *)err_string._0_8_),
          iVar1 != 0) {
      local_90 = armci_domain_same_id(in_stack_fffffffffffff924,in_stack_fffffffffffff920);
      if (local_88 == 0) {
        local_90 = (uint)((local_90 != 0 ^ 0xffU) & 1);
      }
      if (local_90 != 0) {
        local_650 = *local_658 - *local_18;
        lVar2 = 1;
        for (nb_handle = (armci_hdl_t *)0x0; (long)nb_handle < (long)(local_8c + -1);
            nb_handle = (armci_hdl_t *)((long)nb_handle + 1)) {
          lVar2 = *(long *)(local_30 + (long)nb_handle * 8) * lVar2;
          local_650 = lVar2 * (local_658[(long)nb_handle + 1] - local_18[(long)nb_handle + 1]) +
                      local_650;
        }
        src_ptr = (void *)(local_68 * local_650 + local_28);
        for (local_684 = 0; local_684 < local_8c; local_684 = local_684 + 1) {
          local_648[local_684] =
               ((int)*(undefined8 *)(local_660 + (long)local_684 * 8) - (int)local_658[local_684]) +
               1;
        }
        local_628[0] = (int)local_68;
        local_648[0] = local_648[0] * local_628[0];
        local_608[0] = local_628[0];
        for (iVar1 = 0; iVar1 < local_8c + -1; iVar1 = iVar1 + 1) {
          local_608[iVar1] = (int)local_5e8[iVar1] * local_608[iVar1];
          local_628[iVar1] = (int)*(undefined8 *)(local_30 + (long)iVar1 * 8) * local_628[iVar1];
          local_608[iVar1 + 1] = local_608[iVar1];
          local_628[iVar1 + 1] = local_628[iVar1];
        }
        if (GA_fence_set != 0) {
          fence_array[local_94] = '\x01';
        }
        if (local_94 == GAme) {
          local_60 = 1;
          for (in_stack_fffffffffffff974 = 0; in_stack_fffffffffffff974 < local_8c;
              in_stack_fffffffffffff974 = in_stack_fffffffffffff974 + 1) {
            local_60 = ((*(long *)(local_660 + (long)in_stack_fffffffffffff974 * 8) -
                        local_658[in_stack_fffffffffffff974]) + 1) * local_60;
          }
          GAbytes.accloc = (double)local_68 * (double)local_60 + GAbytes.accloc;
        }
        if (in_stack_00000008 == 0) {
          in_stack_fffffffffffff920 = local_8c + -1;
          ARMCI_AccS((int)((ulong)in_stack_fffffffffffff950 >> 0x20),in_stack_fffffffffffff948,
                     in_stack_fffffffffffff940,
                     (int *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
                     in_stack_fffffffffffff930,(int *)CONCAT44(in_stack_fffffffffffff92c,local_94),
                     in_stack_fffffffffffff960,in_stack_fffffffffffff968,in_stack_fffffffffffff970);
        }
        else {
          in_stack_fffffffffffff950 = local_628;
          in_stack_fffffffffffff960 = local_608;
          in_stack_fffffffffffff920 = local_8c + -1;
          in_stack_fffffffffffff93c = local_84;
          in_stack_fffffffffffff940 = local_38;
          in_stack_fffffffffffff970 = local_94;
          optype_00 = iStack_66c;
          in_stack_fffffffffffff930 = get_armci_nbhandle(local_38);
          ARMCI_NbAccS(optype_00,in_stack_fffffffffffff950,src_ptr,(int *)in_stack_fffffffffffff940,
                       (void *)CONCAT44(in_stack_fffffffffffff93c,in_stack_fffffffffffff938),
                       in_stack_fffffffffffff930,
                       (int *)CONCAT44(in_stack_fffffffffffff974,in_stack_fffffffffffff970),iVar1,
                       (int)lVar2,nb_handle);
          in_stack_fffffffffffff948 = src_ptr;
        }
      }
    }
  }
  gai_iterator_destroy((_iterator_hdl *)0x1e553e);
  return;
}

Assistant:

void ngai_acc_common(Integer g_a,
                   Integer *lo,
                   Integer *hi,
                   void    *buf,
                   Integer *ld,
                   void    *alpha,
                   Integer *nbhandle)
{
  Integer  p, np=0, handle=GA_OFFSET + g_a;
  Integer  idx, elems, size, type, p_handle, ga_nbhandle;
  int optype=-1, loop, ndim, cond;
  int proc;
  int num_loops=2; /* 1st loop for remote procs; 2nd loop for local procs */
  Integer n_rstrctd;
  Integer *rank_rstrctd;
  _iterator_hdl it_hdl;

  GA_Internal_Threadsafe_Lock();

  ga_check_handleM(g_a, "ngai_acc_common");

  size = GA[handle].elemsize;
  type = GA[handle].type;
  ndim = GA[handle].ndim;
  p_handle = GA[handle].p_handle;
  n_rstrctd = (Integer)GA[handle].num_rstrctd;
  rank_rstrctd = GA[handle].rank_rstrctd;

  if(type==C_DBL) optype= ARMCI_ACC_DBL;
  else if(type==C_FLOAT) optype= ARMCI_ACC_FLT;
  else if(type==C_DCPL)optype= ARMCI_ACC_DCP;
  else if(type==C_SCPL)optype= ARMCI_ACC_CPL;
  else if(type==C_INT)optype= ARMCI_ACC_INT;
  else if(type==C_LONG)optype= ARMCI_ACC_LNG;
  else pnga_error("type not supported",type);

  gai_iterator_init(g_a, lo, hi, &it_hdl);

#ifndef NO_GA_STATS
  gam_CountElems(ndim, lo, hi, &elems);
  GAbytes.acctot += (double)size*elems;
  GAstat.numacc++;
  GAstat.numacc_procs += np;
#endif

  if(nbhandle)ga_init_nbhandle(nbhandle);
  else ga_init_nbhandle(&ga_nbhandle);

#ifdef PROFILE_OLD
  ga_profile_start((int)handle, (long)size*elems, ndim, lo, hi,
      ENABLE_PROFILE_ACC);
#endif

  for(loop=0; loop<num_loops; loop++) {
    Integer ldrem[MAXDIM];
    int stride_rem[MAXDIM], stride_loc[MAXDIM], count[MAXDIM];
    Integer idx_buf, *plo, *phi;
    char *pbuf, *prem;
    gai_iterator_reset(&it_hdl);

    while (gai_iterator_next(&it_hdl, &proc, &plo, &phi, &prem, ldrem)) {

      /* check if it is local to SMP */
      cond = armci_domain_same_id(ARMCI_DOMAIN_SMP,(int)proc);
      if(loop==0) cond = !cond;

      if(cond) {

        /* find the right spot in the user buffer */
        gam_ComputePatchIndex(ndim,lo, plo, ld, &idx_buf);
        pbuf = size*idx_buf + (char*)buf;

        gam_ComputeCount(ndim, plo, phi, count);

        /* scale number of rows by element size */
        count[0] *= size;
        gam_setstride(ndim, size, ld, ldrem, stride_rem, stride_loc);

        if(GA_fence_set)fence_array[proc]=1;

#ifndef NO_GA_STATS
        if(proc == GAme){
          gam_CountElems(ndim, plo, phi, &elems);
          GAbytes.accloc += (double)size*elems;
        }
#endif

        if(nbhandle) {
          ARMCI_NbAccS(optype, alpha, pbuf, stride_loc, prem,
              stride_rem, count, ndim-1, proc,
              (armci_hdl_t*)get_armci_nbhandle(nbhandle));
        } else {
#  if !defined(DISABLE_NBOPT)
          if((loop==0 && gai_iterator_last(&it_hdl)) || loop==1) {
            ARMCI_AccS(optype, alpha, pbuf, stride_loc, prem, stride_rem, 
                count, ndim-1, proc);
          } else {
            ARMCI_NbAccS(optype, alpha, pbuf, stride_loc, prem, 
                stride_rem, count, ndim-1, proc,
                (armci_hdl_t*)get_armci_nbhandle(&ga_nbhandle));
          }
#  else
          ARMCI_AccS(optype, alpha, pbuf, stride_loc, prem, stride_rem,
              count, ndim-1, proc);
#  endif
        }
      } /* end if(cond) */
    }
  }
#if !defined(DISABLE_NBOPT)
  if(!nbhandle) nga_wait_internal(&ga_nbhandle);
#endif

#ifdef PROFILE_OLD
  ga_profile_stop();
#endif
  GA_Internal_Threadsafe_Unlock();

  gai_iterator_destroy(&it_hdl);
}